

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int file_close(file_t *file)

{
  int iVar1;
  file_t *file_local;
  
  if (file != (file_t *)0x0) {
    if ((file->fd == 0) || (iVar1 = close(file->fd), -1 < iVar1)) {
      file_local._4_4_ = 1;
    }
    else {
      perror("close");
      file_local._4_4_ = 0;
    }
    return file_local._4_4_;
  }
  __assert_fail("file != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",0x7b,
                "int file_close(file_t *)");
}

Assistant:

int file_close(file_t *file) {
  assert(file != NULL);

  if (file->fd != STDIN_FILENO) {
    if (close(file->fd) < 0) {
      perror("close");
      return 0;
    }
  }

  return 1;
}